

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

void __thiscall
CivetServer::CivetServer
          (CivetServer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *options,CivetCallbacks *_callbacks,void *UserContextIn)

{
  char **ppcVar1;
  size_type sVar2;
  char **ppcVar3;
  value_type pcVar4;
  reference ppcVar5;
  mg_context *pmVar6;
  CivetException *this_00;
  allocator local_249;
  undefined1 local_248 [8];
  string exceptionMsg;
  char errtxtbuf [256];
  mg_error_data mg_start_error_data;
  undefined1 auStack_108 [8];
  mg_init_data mg_start_init_data;
  size_t i;
  undefined1 local_e0 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> pointers;
  undefined1 local_b8 [8];
  CivetCallbacks callbacks;
  void *UserContextIn_local;
  CivetCallbacks *_callbacks_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *options_local;
  CivetServer *this_local;
  
  this->_vptr_CivetServer = (_func_int **)&PTR__CivetServer_0022f3c0;
  this->context = (mg_context *)0x0;
  callbacks.super_mg_callbacks.init_connection =
       (_func_int_mg_connection_ptr_void_ptr_ptr *)UserContextIn;
  std::
  map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
  ::map(&this->connections);
  CivetCallbacks::CivetCallbacks((CivetCallbacks *)local_b8);
  this->UserContext = callbacks.super_mg_callbacks.init_connection;
  if (_callbacks == (CivetCallbacks *)0x0) {
    this->userCloseHandler = (_func_void_mg_connection_ptr *)0x0;
  }
  else {
    memcpy(local_b8,_callbacks,0x90);
    this->userCloseHandler = (_callbacks->super_mg_callbacks).connection_close;
  }
  callbacks.super_mg_callbacks.external_ssl_ctx_domain = closeHandler;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(options);
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)((long)&i + 7));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,sVar2 + 1,
             (allocator<const_char_*> *)((long)&i + 7));
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)((long)&i + 7));
  mg_start_init_data.configuration_options = (char **)0x0;
  while( true ) {
    ppcVar1 = mg_start_init_data.configuration_options;
    ppcVar3 = (char **)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(options);
    if (ppcVar3 <= ppcVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](options,(size_type)mg_start_init_data.configuration_options);
    pcVar4 = (value_type)std::__cxx11::string::c_str();
    ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,
                         (size_type)mg_start_init_data.configuration_options);
    *ppcVar5 = pcVar4;
    mg_start_init_data.configuration_options =
         (char **)((long)mg_start_init_data.configuration_options + 1);
  }
  ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::back
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0);
  *ppcVar5 = (value_type)0x0;
  mg_start_init_data.user_data = (void *)0x0;
  auStack_108 = (undefined1  [8])local_b8;
  mg_start_init_data.callbacks = (mg_callbacks *)this;
  mg_start_init_data.user_data =
       std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,0);
  errtxtbuf[0xf8] = '\0';
  errtxtbuf[0xf9] = '\0';
  errtxtbuf[0xfa] = '\0';
  errtxtbuf[0xfb] = '\0';
  errtxtbuf[0xfc] = '\0';
  errtxtbuf[0xfd] = '\0';
  errtxtbuf[0xfe] = '\0';
  errtxtbuf[0xff] = '\0';
  errtxtbuf[0xe8] = '\0';
  errtxtbuf[0xe9] = '\0';
  errtxtbuf[0xea] = '\0';
  errtxtbuf[0xeb] = '\0';
  errtxtbuf[0xec] = '\0';
  errtxtbuf[0xed] = '\0';
  errtxtbuf[0xee] = '\0';
  errtxtbuf[0xef] = '\0';
  errtxtbuf[0xf0] = '\0';
  errtxtbuf[0xf1] = '\0';
  errtxtbuf[0xf2] = '\0';
  errtxtbuf[0xf3] = '\0';
  errtxtbuf[0xf4] = '\0';
  errtxtbuf[0xf5] = '\0';
  errtxtbuf[0xf6] = '\0';
  errtxtbuf[0xf7] = '\0';
  errtxtbuf[0xd8] = '\0';
  errtxtbuf[0xd9] = '\0';
  errtxtbuf[0xda] = '\0';
  errtxtbuf[0xdb] = '\0';
  errtxtbuf[0xdc] = '\0';
  errtxtbuf[0xdd] = '\0';
  errtxtbuf[0xde] = '\0';
  errtxtbuf[0xdf] = '\0';
  errtxtbuf[0xe0] = '\0';
  errtxtbuf[0xe1] = '\0';
  errtxtbuf[0xe2] = '\0';
  errtxtbuf[0xe3] = '\0';
  errtxtbuf[0xe4] = '\0';
  errtxtbuf[0xe5] = '\0';
  errtxtbuf[0xe6] = '\0';
  errtxtbuf[0xe7] = '\0';
  errtxtbuf[200] = '\0';
  errtxtbuf[0xc9] = '\0';
  errtxtbuf[0xca] = '\0';
  errtxtbuf[0xcb] = '\0';
  errtxtbuf[0xcc] = '\0';
  errtxtbuf[0xcd] = '\0';
  errtxtbuf[0xce] = '\0';
  errtxtbuf[0xcf] = '\0';
  errtxtbuf[0xd0] = '\0';
  errtxtbuf[0xd1] = '\0';
  errtxtbuf[0xd2] = '\0';
  errtxtbuf[0xd3] = '\0';
  errtxtbuf[0xd4] = '\0';
  errtxtbuf[0xd5] = '\0';
  errtxtbuf[0xd6] = '\0';
  errtxtbuf[0xd7] = '\0';
  errtxtbuf[0xb8] = '\0';
  errtxtbuf[0xb9] = '\0';
  errtxtbuf[0xba] = '\0';
  errtxtbuf[0xbb] = '\0';
  errtxtbuf[0xbc] = '\0';
  errtxtbuf[0xbd] = '\0';
  errtxtbuf[0xbe] = '\0';
  errtxtbuf[0xbf] = '\0';
  errtxtbuf[0xc0] = '\0';
  errtxtbuf[0xc1] = '\0';
  errtxtbuf[0xc2] = '\0';
  errtxtbuf[0xc3] = '\0';
  errtxtbuf[0xc4] = '\0';
  errtxtbuf[0xc5] = '\0';
  errtxtbuf[0xc6] = '\0';
  errtxtbuf[199] = '\0';
  errtxtbuf[0xa8] = '\0';
  errtxtbuf[0xa9] = '\0';
  errtxtbuf[0xaa] = '\0';
  errtxtbuf[0xab] = '\0';
  errtxtbuf[0xac] = '\0';
  errtxtbuf[0xad] = '\0';
  errtxtbuf[0xae] = '\0';
  errtxtbuf[0xaf] = '\0';
  errtxtbuf[0xb0] = '\0';
  errtxtbuf[0xb1] = '\0';
  errtxtbuf[0xb2] = '\0';
  errtxtbuf[0xb3] = '\0';
  errtxtbuf[0xb4] = '\0';
  errtxtbuf[0xb5] = '\0';
  errtxtbuf[0xb6] = '\0';
  errtxtbuf[0xb7] = '\0';
  errtxtbuf[0x98] = '\0';
  errtxtbuf[0x99] = '\0';
  errtxtbuf[0x9a] = '\0';
  errtxtbuf[0x9b] = '\0';
  errtxtbuf[0x9c] = '\0';
  errtxtbuf[0x9d] = '\0';
  errtxtbuf[0x9e] = '\0';
  errtxtbuf[0x9f] = '\0';
  errtxtbuf[0xa0] = '\0';
  errtxtbuf[0xa1] = '\0';
  errtxtbuf[0xa2] = '\0';
  errtxtbuf[0xa3] = '\0';
  errtxtbuf[0xa4] = '\0';
  errtxtbuf[0xa5] = '\0';
  errtxtbuf[0xa6] = '\0';
  errtxtbuf[0xa7] = '\0';
  errtxtbuf[0x88] = '\0';
  errtxtbuf[0x89] = '\0';
  errtxtbuf[0x8a] = '\0';
  errtxtbuf[0x8b] = '\0';
  errtxtbuf[0x8c] = '\0';
  errtxtbuf[0x8d] = '\0';
  errtxtbuf[0x8e] = '\0';
  errtxtbuf[0x8f] = '\0';
  errtxtbuf[0x90] = '\0';
  errtxtbuf[0x91] = '\0';
  errtxtbuf[0x92] = '\0';
  errtxtbuf[0x93] = '\0';
  errtxtbuf[0x94] = '\0';
  errtxtbuf[0x95] = '\0';
  errtxtbuf[0x96] = '\0';
  errtxtbuf[0x97] = '\0';
  errtxtbuf[0x78] = '\0';
  errtxtbuf[0x79] = '\0';
  errtxtbuf[0x7a] = '\0';
  errtxtbuf[0x7b] = '\0';
  errtxtbuf[0x7c] = '\0';
  errtxtbuf[0x7d] = '\0';
  errtxtbuf[0x7e] = '\0';
  errtxtbuf[0x7f] = '\0';
  errtxtbuf[0x80] = '\0';
  errtxtbuf[0x81] = '\0';
  errtxtbuf[0x82] = '\0';
  errtxtbuf[0x83] = '\0';
  errtxtbuf[0x84] = '\0';
  errtxtbuf[0x85] = '\0';
  errtxtbuf[0x86] = '\0';
  errtxtbuf[0x87] = '\0';
  errtxtbuf[0x68] = '\0';
  errtxtbuf[0x69] = '\0';
  errtxtbuf[0x6a] = '\0';
  errtxtbuf[0x6b] = '\0';
  errtxtbuf[0x6c] = '\0';
  errtxtbuf[0x6d] = '\0';
  errtxtbuf[0x6e] = '\0';
  errtxtbuf[0x6f] = '\0';
  errtxtbuf[0x70] = '\0';
  errtxtbuf[0x71] = '\0';
  errtxtbuf[0x72] = '\0';
  errtxtbuf[0x73] = '\0';
  errtxtbuf[0x74] = '\0';
  errtxtbuf[0x75] = '\0';
  errtxtbuf[0x76] = '\0';
  errtxtbuf[0x77] = '\0';
  errtxtbuf[0x58] = '\0';
  errtxtbuf[0x59] = '\0';
  errtxtbuf[0x5a] = '\0';
  errtxtbuf[0x5b] = '\0';
  errtxtbuf[0x5c] = '\0';
  errtxtbuf[0x5d] = '\0';
  errtxtbuf[0x5e] = '\0';
  errtxtbuf[0x5f] = '\0';
  errtxtbuf[0x60] = '\0';
  errtxtbuf[0x61] = '\0';
  errtxtbuf[0x62] = '\0';
  errtxtbuf[99] = '\0';
  errtxtbuf[100] = '\0';
  errtxtbuf[0x65] = '\0';
  errtxtbuf[0x66] = '\0';
  errtxtbuf[0x67] = '\0';
  errtxtbuf[0x48] = '\0';
  errtxtbuf[0x49] = '\0';
  errtxtbuf[0x4a] = '\0';
  errtxtbuf[0x4b] = '\0';
  errtxtbuf[0x4c] = '\0';
  errtxtbuf[0x4d] = '\0';
  errtxtbuf[0x4e] = '\0';
  errtxtbuf[0x4f] = '\0';
  errtxtbuf[0x50] = '\0';
  errtxtbuf[0x51] = '\0';
  errtxtbuf[0x52] = '\0';
  errtxtbuf[0x53] = '\0';
  errtxtbuf[0x54] = '\0';
  errtxtbuf[0x55] = '\0';
  errtxtbuf[0x56] = '\0';
  errtxtbuf[0x57] = '\0';
  errtxtbuf[0x38] = '\0';
  errtxtbuf[0x39] = '\0';
  errtxtbuf[0x3a] = '\0';
  errtxtbuf[0x3b] = '\0';
  errtxtbuf[0x3c] = '\0';
  errtxtbuf[0x3d] = '\0';
  errtxtbuf[0x3e] = '\0';
  errtxtbuf[0x3f] = '\0';
  errtxtbuf[0x40] = '\0';
  errtxtbuf[0x41] = '\0';
  errtxtbuf[0x42] = '\0';
  errtxtbuf[0x43] = '\0';
  errtxtbuf[0x44] = '\0';
  errtxtbuf[0x45] = '\0';
  errtxtbuf[0x46] = '\0';
  errtxtbuf[0x47] = '\0';
  errtxtbuf[0x28] = '\0';
  errtxtbuf[0x29] = '\0';
  errtxtbuf[0x2a] = '\0';
  errtxtbuf[0x2b] = '\0';
  errtxtbuf[0x2c] = '\0';
  errtxtbuf[0x2d] = '\0';
  errtxtbuf[0x2e] = '\0';
  errtxtbuf[0x2f] = '\0';
  errtxtbuf[0x30] = '\0';
  errtxtbuf[0x31] = '\0';
  errtxtbuf[0x32] = '\0';
  errtxtbuf[0x33] = '\0';
  errtxtbuf[0x34] = '\0';
  errtxtbuf[0x35] = '\0';
  errtxtbuf[0x36] = '\0';
  errtxtbuf[0x37] = '\0';
  errtxtbuf[0x18] = '\0';
  errtxtbuf[0x19] = '\0';
  errtxtbuf[0x1a] = '\0';
  errtxtbuf[0x1b] = '\0';
  errtxtbuf[0x1c] = '\0';
  errtxtbuf[0x1d] = '\0';
  errtxtbuf[0x1e] = '\0';
  errtxtbuf[0x1f] = '\0';
  errtxtbuf[0x20] = '\0';
  errtxtbuf[0x21] = '\0';
  errtxtbuf[0x22] = '\0';
  errtxtbuf[0x23] = '\0';
  errtxtbuf[0x24] = '\0';
  errtxtbuf[0x25] = '\0';
  errtxtbuf[0x26] = '\0';
  errtxtbuf[0x27] = '\0';
  errtxtbuf[8] = '\0';
  errtxtbuf[9] = '\0';
  errtxtbuf[10] = '\0';
  errtxtbuf[0xb] = '\0';
  errtxtbuf[0xc] = '\0';
  errtxtbuf[0xd] = '\0';
  errtxtbuf[0xe] = '\0';
  errtxtbuf[0xf] = '\0';
  errtxtbuf[0x10] = '\0';
  errtxtbuf[0x11] = '\0';
  errtxtbuf[0x12] = '\0';
  errtxtbuf[0x13] = '\0';
  errtxtbuf[0x14] = '\0';
  errtxtbuf[0x15] = '\0';
  errtxtbuf[0x16] = '\0';
  errtxtbuf[0x17] = '\0';
  exceptionMsg.field_2._8_8_ = 0;
  errtxtbuf[0] = '\0';
  errtxtbuf[1] = '\0';
  errtxtbuf[2] = '\0';
  errtxtbuf[3] = '\0';
  errtxtbuf[4] = '\0';
  errtxtbuf[5] = '\0';
  errtxtbuf[6] = '\0';
  errtxtbuf[7] = '\0';
  pmVar6 = mg_start2((mg_init_data *)auStack_108,(mg_error_data *)(errtxtbuf + 0xf8));
  this->context = pmVar6;
  if (this->context == (mg_context *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_248,
               "null context when constructing CivetServer. Possible problem binding to port. Error: "
               ,&local_249);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::operator+=((string *)local_248,exceptionMsg.field_2._M_local_buf + 8);
    this_00 = (CivetException *)__cxa_allocate_exception(0x10);
    CivetException::CivetException(this_00,(string *)local_248);
    __cxa_throw(this_00,&CivetException::typeinfo,CivetException::~CivetException);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0);
  return;
}

Assistant:

CivetServer::CivetServer(const std::vector<std::string> &options,
                         const struct CivetCallbacks *_callbacks,
                         const void *UserContextIn)
    : context(0)
{
	struct CivetCallbacks callbacks;

	UserContext = UserContextIn;

	if (_callbacks) {
		callbacks = *_callbacks;
		userCloseHandler = _callbacks->connection_close;
	} else {
		userCloseHandler = NULL;
	}
	callbacks.connection_close = closeHandler;

	std::vector<const char *> pointers(options.size() + 1);
	for (size_t i = 0; i < options.size(); i++) {
		pointers[i] = (options[i].c_str());
	}
	pointers.back() = NULL;

	struct mg_init_data mg_start_init_data = {0};
	mg_start_init_data.callbacks = &callbacks;
	mg_start_init_data.user_data = this;
	mg_start_init_data.configuration_options = &pointers[0];

	struct mg_error_data mg_start_error_data = {0};
	char errtxtbuf[256] = {0};
	mg_start_error_data.text = errtxtbuf;
	mg_start_error_data.text_buffer_size = sizeof(errtxtbuf);

	context = mg_start2(&mg_start_init_data, &mg_start_error_data);

	if (context == NULL) {
		std::string exceptionMsg =
		    "null context when constructing CivetServer. "
		    "Possible problem binding to port. Error: ";
		exceptionMsg += errtxtbuf;
		throw CivetException(exceptionMsg);
	}
}